

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitI31Get(FunctionValidator *this,I31Get *curr)

{
  bool result;
  Module *pMVar1;
  HeapType local_30;
  Type local_28;
  Type local_20;
  I31Get *local_18;
  I31Get *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (I31Get *)this;
  pMVar1 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  result = FeatureSet::hasGC(&pMVar1->features);
  shouldBeTrue<wasm::I31Get*>(this,result,local_18,"i31.get_s/u requires gc [--enable-gc]");
  local_20.id = (local_18->i31->type).id;
  HeapType::HeapType(&local_30,i31);
  wasm::Type::Type(&local_28,local_30,Nullable);
  shouldBeSubType(this,local_20,local_28,local_18->i31,"i31.get_s/u\'s argument should be i31ref");
  return;
}

Assistant:

void FunctionValidator::visitI31Get(I31Get* curr) {
  shouldBeTrue(getModule()->features.hasGC(),
               curr,
               "i31.get_s/u requires gc [--enable-gc]");
  shouldBeSubType(curr->i31->type,
                  Type(HeapType::i31, Nullable),
                  curr->i31,
                  "i31.get_s/u's argument should be i31ref");
}